

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yin.c
# Opt level: O3

LY_ERR yin_parse_augment(lysp_yin_ctx *ctx,tree_node_meta *aug_meta)

{
  lysp_node *plVar1;
  lysp_ext_instance *object;
  yin_subelement *subelems_00;
  LY_ERR LVar2;
  LY_ERR LVar3;
  lysp_node *parent;
  lysp_node *plVar4;
  LY_ERR ret__;
  lysp_node **pplVar5;
  yin_subelement *subelems;
  char **local_48;
  lysp_qname **local_40;
  char **local_38;
  
  pplVar5 = aug_meta->nodes;
  subelems = (yin_subelement *)0x0;
  parent = (lysp_node *)calloc(1,0x60);
  if (parent == (lysp_node *)0x0) {
    LVar2 = LY_EMEM;
    ly_log(ctx->xmlctx->ctx,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","yin_parse_augment")
    ;
  }
  else {
    plVar1 = *pplVar5;
    if (*pplVar5 != (lysp_node *)0x0) {
      do {
        plVar4 = plVar1;
        plVar1 = plVar4->next;
      } while (plVar1 != (lysp_node *)0x0);
      pplVar5 = &plVar4->next;
    }
    *pplVar5 = parent;
    parent->nodetype = 0x8000;
    parent->parent = aug_meta->parent;
    LVar2 = lyxml_ctx_next(ctx->xmlctx);
    if (LVar2 == LY_SUCCESS) {
      LVar2 = yin_parse_attribute(ctx,YIN_ARG_TARGET_NODE,&parent->name,Y_STR_ARG,LY_STMT_AUGMENT);
      if (LVar2 == LY_SUCCESS) {
        if (*parent->name == '\0') {
          ly_log((ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1],
                 LY_LLWRN,LY_SUCCESS,"Empty argument of %s statement does not make sense.","augment"
                );
        }
        plVar1 = parent + 1;
        local_38 = &parent->dsc;
        local_40 = &parent->iffeatures;
        local_48 = &parent[1].name;
        LVar3 = subelems_allocator(ctx,0x11,parent,&subelems,8,&parent[1].next,8,0x20,plVar1,8,0x40,
                                   plVar1,0,0x100,plVar1,0,0x200,plVar1,0,0x400,plVar1,0,0x80000,
                                   local_38,2,0x130000,local_40,0,0x1000,plVar1,0,0x2000,plVar1,0,
                                   0x4000,plVar1,0,1,local_48,8,0x270000,&parent->ref,2,0x2c0000,
                                   &parent->flags,2,0x8000,plVar1,0,0x330000,&parent[1].nodetype,2,
                                   0xf0000,0,0);
        subelems_00 = subelems;
        LVar2 = LY_EMEM;
        if (LVar3 == LY_SUCCESS) {
          LVar2 = yin_parse_content(ctx,subelems,0x11,parent,LY_STMT_AUGMENT,(char **)0x0,
                                    &parent->exts);
          subelems_deallocator(0x11,subelems_00);
          if (LVar2 == LY_SUCCESS) {
            object = parent->exts;
            if (object != (lysp_ext_instance *)0x0) {
              LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,object,'\x01',(uint32_t *)0x0);
              if (LVar2 != LY_SUCCESS) {
                return LVar2 + (LVar2 == LY_SUCCESS);
              }
            }
            LVar2 = LY_SUCCESS;
          }
        }
      }
    }
  }
  return LVar2;
}

Assistant:

static LY_ERR
yin_parse_augment(struct lysp_yin_ctx *ctx, struct tree_node_meta *aug_meta)
{
    struct lysp_node_augment *aug;
    struct lysp_node_augment **augs = (struct lysp_node_augment **)aug_meta->nodes;
    LY_ERR ret = LY_SUCCESS;
    struct yin_subelement *subelems = NULL;
    size_t subelems_size;

    /* create new augment */
    LY_LIST_NEW_RET(ctx->xmlctx->ctx, augs, aug, next, LY_EMEM);
    aug->nodetype = LYS_AUGMENT;
    aug->parent = aug_meta->parent;

    /* parse argument */
    LY_CHECK_RET(lyxml_ctx_next(ctx->xmlctx));
    LY_CHECK_RET(yin_parse_attribute(ctx, YIN_ARG_TARGET_NODE, &aug->nodeid, Y_STR_ARG, LY_STMT_AUGMENT));
    CHECK_NONEMPTY((struct lysp_ctx *)ctx, strlen(aug->nodeid), "augment");

    /* parser augment content */
    LY_CHECK_RET(subelems_allocator(ctx, subelems_size = 17, (struct lysp_node *)aug, &subelems,
            LY_STMT_ACTION, &aug->actions, YIN_SUBELEM_VER2,
            LY_STMT_ANYDATA, &aug->child, YIN_SUBELEM_VER2,
            LY_STMT_ANYXML, &aug->child, 0,
            LY_STMT_CASE, &aug->child, 0,
            LY_STMT_CHOICE, &aug->child, 0,
            LY_STMT_CONTAINER, &aug->child, 0,
            LY_STMT_DESCRIPTION, &aug->dsc, YIN_SUBELEM_UNIQUE,
            LY_STMT_IF_FEATURE, &aug->iffeatures, 0,
            LY_STMT_LEAF, &aug->child, 0,
            LY_STMT_LEAF_LIST, &aug->child, 0,
            LY_STMT_LIST, &aug->child, 0,
            LY_STMT_NOTIFICATION, &aug->notifs, YIN_SUBELEM_VER2,
            LY_STMT_REFERENCE, &aug->ref, YIN_SUBELEM_UNIQUE,
            LY_STMT_STATUS, &aug->flags, YIN_SUBELEM_UNIQUE,
            LY_STMT_USES, &aug->child, 0,
            LY_STMT_WHEN, &aug->when, YIN_SUBELEM_UNIQUE,
            LY_STMT_EXTENSION_INSTANCE, NULL, 0));
    ret = yin_parse_content(ctx, subelems, subelems_size, aug, LY_STMT_AUGMENT, NULL, &aug->exts);
    subelems_deallocator(subelems_size, subelems);
    LY_CHECK_RET(ret);

    /* store extension instance array (no realloc anymore) to find the plugin records and finish parsing */
    LY_CHECK_RET(yin_unres_exts_add(ctx, aug->exts));

    return LY_SUCCESS;
}